

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BasicFboMultisampleCase::render(BasicFboMultisampleCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int iVar1;
  ChannelOrder CVar2;
  DataType DVar3;
  deUint32 program;
  deUint32 program_00;
  uint uVar4;
  Context *pCVar6;
  int i;
  long lVar7;
  int ndx_2;
  deUint32 *renderbuffers;
  deUint32 *framebuffers;
  int ndx;
  int ndx_1;
  int iVar8;
  deUint32 *renderbuffers_00;
  bool bVar9;
  float fVar10;
  float fVar11;
  Vector<float,_4> res_1;
  deUint32 resolveFbo;
  Vector<float,_4> res;
  Random rnd;
  deUint32 msaaFbo;
  float local_398 [7];
  float local_37c;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  float local_360;
  float local_35c;
  deUint32 resolveDepthStencilRbo;
  deUint32 msaaDepthStencilRbo;
  deUint32 resolveColorRbo;
  deUint32 msaaColorRbo;
  TextureFormat colorFmt;
  TextureFormatInfo colorFmtInfo;
  float local_2f8 [6];
  FlatColorShader flatShader;
  GradientShader gradShader;
  TextureFormat TVar5;
  
  colorFmt = glu::mapGLInternalFormat(this->m_colorFormat);
  if (this->m_depthStencilFormat == 0) {
    CVar2 = CHANNELORDER_LAST;
  }
  else {
    TVar5 = glu::mapGLInternalFormat(this->m_depthStencilFormat);
    CVar2 = TVar5.order;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  DVar3 = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::GradientShader::GradientShader(&gradShader,DVar3);
  DVar3 = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,DVar3);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&gradShader);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program_00 = (*pCVar6->_vptr_Context[0x75])(pCVar6,&flatShader);
  uVar4 = CVar2 - S;
  msaaFbo = 0;
  resolveFbo = 0;
  msaaColorRbo = 0;
  resolveColorRbo = 0;
  msaaDepthStencilRbo = 0;
  resolveDepthStencilRbo = 0;
  iVar8 = 1;
  do {
    bVar9 = iVar8 == 1;
    framebuffers = &resolveFbo;
    if (bVar9) {
      framebuffers = &msaaFbo;
    }
    renderbuffers = &resolveColorRbo;
    if (bVar9) {
      renderbuffers = &msaaColorRbo;
    }
    renderbuffers_00 = &resolveDepthStencilRbo;
    if (bVar9) {
      renderbuffers_00 = &msaaDepthStencilRbo;
    }
    iVar1 = this->m_numSamples;
    if (!bVar9) {
      iVar1 = 0;
    }
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (this_00,0x8d41,iVar1,this->m_colorFormat,(this->m_size).m_data[0],
               (this->m_size).m_data[1]);
    if (((CVar2 == D) || (CVar2 == DS)) || (uVar4 < 2)) {
      sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers_00);
      sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers_00);
      sglr::ContextWrapper::glRenderbufferStorageMultisample
                (this_00,0x8d41,iVar1,this->m_depthStencilFormat,(this->m_size).m_data[0],
                 (this->m_size).m_data[1]);
    }
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,framebuffers);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    if ((CVar2 == DS) || (CVar2 == D)) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (this_00,0x8d40,0x8d00,0x8d41,*renderbuffers_00);
    }
    if (uVar4 < 2) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (this_00,0x8d40,0x8d20,0x8d41,*renderbuffers_00);
    }
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
    iVar8 = iVar8 + -1;
  } while (iVar8 == 0);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,msaaFbo);
  sglr::ContextWrapper::glViewport(this_00,0,0,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar6,program,&colorFmtInfo.valueMin,&colorFmtInfo.valueMax);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  rnd.m_rnd.x = 0xbf800000;
  rnd.m_rnd.y = 0xbf800000;
  rnd.m_rnd.z = 0xbf800000;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data[2] = 1.0;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&rnd,(Vec3 *)&res_1);
  deRandom_init(&rnd.m_rnd,9);
  sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,0,0xff);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e02);
  iVar8 = 0;
  do {
    fVar10 = deRandom_getFloat(&rnd.m_rnd);
    local_35c = deRandom_getFloat(&rnd.m_rnd);
    local_360 = deRandom_getFloat(&rnd.m_rnd);
    local_364 = deRandom_getFloat(&rnd.m_rnd);
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_368 = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_36c = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_370 = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_374 = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_378 = fVar11 + fVar11 + -1.0;
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    local_37c = fVar11 + fVar11 + -1.0;
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_398[1] = local_35c;
    local_398[0] = fVar10;
    local_398[3] = local_364;
    local_398[2] = local_360;
    local_2f8[0] = 0.0;
    local_2f8[1] = 0.0;
    local_2f8[2] = 0.0;
    local_2f8[3] = 0.0;
    lVar7 = 0;
    do {
      local_2f8[lVar7] = colorFmtInfo.valueMax.m_data[lVar7] - colorFmtInfo.valueMin.m_data[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar7 = 0;
    do {
      res.m_data[lVar7] = local_398[lVar7] * local_2f8[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar7 = 0;
    do {
      res_1.m_data[lVar7] = res.m_data[lVar7] + colorFmtInfo.valueMin.m_data[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program_00,&res_1);
    pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
    res_1.m_data[1] = local_36c;
    res_1.m_data[0] = local_368;
    res_1.m_data[2] = local_370;
    res.m_data[1] = local_378;
    res.m_data[0] = local_374;
    res.m_data[2] = local_37c;
    sglr::drawQuad(pCVar6,program_00,(Vec3 *)&res_1,(Vec3 *)&res);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 8);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  FboTestCase::checkError(&this->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,resolveFbo);
  iVar8 = (this->m_size).m_data[0];
  iVar1 = (this->m_size).m_data[1];
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,iVar8,iVar1,0,0,iVar8,iVar1,
             (uint)(uVar4 < 2) * 0x400 + (uint)((CVar2 - D & 0xfffffffd) == 0) * 0x100 + 0x4000,
             0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,resolveFbo);
  if ((CVar2 == DS) || (CVar2 == D)) {
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glDepthFunc(this_00,0x201);
    sglr::ContextWrapper::glDepthMask(this_00,0);
    iVar8 = 0;
    sglr::ContextWrapper::glColorMask(this_00,0,0,1,0);
    do {
      fVar10 = (float)iVar8 * 0.25 + -1.0;
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      res.m_data[0] = 0.0;
      res.m_data[1] = 0.0;
      res.m_data[3] = 1.0;
      res.m_data[2] = (float)iVar8 / 7.0;
      local_398[0] = 0.0;
      local_398[1] = 0.0;
      local_398[2] = 0.0;
      local_398[3] = 0.0;
      lVar7 = 0;
      do {
        local_398[lVar7] = colorFmtInfo.valueMax.m_data[lVar7] - colorFmtInfo.valueMin.m_data[lVar7]
        ;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar7 = 0;
      do {
        res_1.m_data[lVar7] = res.m_data[lVar7] * local_398[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      lVar7 = 0;
      do {
        (&rnd.m_rnd.x)[lVar7] =
             (deUint32)(res_1.m_data[lVar7] + colorFmtInfo.valueMin.m_data[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program_00,(Vec4 *)&rnd);
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.x = 0xbf800000;
      rnd.m_rnd.y = 0xbf800000;
      rnd.m_rnd.z = (deUint32)fVar10;
      res_1.m_data._0_8_ = &DAT_3f8000003f800000;
      res_1.m_data[2] = fVar10;
      sglr::drawQuad(pCVar6,program_00,(Vec3 *)&rnd,(Vec3 *)&res_1);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 8);
    sglr::ContextWrapper::glDisable(this_00,0xb71);
  }
  if (uVar4 < 2) {
    sglr::ContextWrapper::glEnable(this_00,0xb90);
    sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e00);
    sglr::ContextWrapper::glColorMask(this_00,0,1,0,0);
    iVar8 = 0;
    do {
      sglr::ContextWrapper::glStencilFunc(this_00,0x202,iVar8,0xff);
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      res.m_data._0_8_ = (ulong)(uint)((float)iVar8 / 3.0) << 0x20;
      res.m_data[2] = 0.0;
      res.m_data[3] = 1.0;
      local_398[0] = 0.0;
      local_398[1] = 0.0;
      local_398[2] = 0.0;
      local_398[3] = 0.0;
      lVar7 = 0;
      do {
        local_398[lVar7] = colorFmtInfo.valueMax.m_data[lVar7] - colorFmtInfo.valueMin.m_data[lVar7]
        ;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      res_1.m_data[0] = 0.0;
      res_1.m_data[1] = 0.0;
      res_1.m_data[2] = 0.0;
      res_1.m_data[3] = 0.0;
      lVar7 = 0;
      do {
        res_1.m_data[lVar7] = res.m_data[lVar7] * local_398[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      lVar7 = 0;
      do {
        (&rnd.m_rnd.x)[lVar7] =
             (deUint32)(res_1.m_data[lVar7] + colorFmtInfo.valueMin.m_data[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program_00,(Vec4 *)&rnd);
      pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.x = 0xbf800000;
      rnd.m_rnd.y = 0xbf800000;
      rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
      res_1.m_data._0_8_ = &DAT_3f8000003f800000;
      res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
      sglr::drawQuad(pCVar6,program_00,(Vec3 *)&rnd,(Vec3 *)&res_1);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
  }
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,(this->m_size).m_data[0],(this->m_size).m_data[1],
             &colorFmt,&colorFmtInfo.lookupScale,&colorFmtInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFormat);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFormat != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFormat) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		FlatColorShader			flatShader				(getFragmentOutputType(colorFmt));
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);
		deUint32				msaaFbo					= 0;
		deUint32				resolveFbo				= 0;
		deUint32				msaaColorRbo			= 0;
		deUint32				resolveColorRbo			= 0;
		deUint32				msaaDepthStencilRbo		= 0;
		deUint32				resolveDepthStencilRbo	= 0;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo				= ndx ? resolveFbo				: msaaFbo;
			deUint32&	colorRbo		= ndx ? resolveColorRbo			: msaaColorRbo;
			deUint32&	depthStencilRbo	= ndx ? resolveDepthStencilRbo	: msaaDepthStencilRbo;
			int			samples			= ndx ? 0						: m_numSamples;

			glGenRenderbuffers(1, &colorRbo);
			glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_colorFormat, m_size.x(), m_size.y());

			if (depth || stencil)
			{
				glGenRenderbuffers(1, &depthStencilRbo);
				glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
				glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_depthStencilFormat, m_size.x(), m_size.y());
			}

			glGenFramebuffers(1, &fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
			if (depth)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
			if (stencil)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, msaaFbo);
		glViewport(0, 0, m_size.x(), m_size.y());

		// Clear depth and stencil buffers.
		glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		// Fill MSAA fbo with gradient, depth = [-1..1]
		glEnable(GL_DEPTH_TEST);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render random-colored quads.
		{
			const int		numQuads	= 8;
			de::Random		rnd			(9);

			glDepthFunc(GL_ALWAYS);
			glEnable(GL_STENCIL_TEST);
			glStencilFunc(GL_ALWAYS, 0, 0xffu);
			glStencilOp(GL_KEEP, GL_KEEP, GL_INCR);

			for (int ndx = 0; ndx < numQuads; ndx++)
			{
				float	r		= rnd.getFloat();
				float	g		= rnd.getFloat();
				float	b		= rnd.getFloat();
				float	a		= rnd.getFloat();
				float	x0		= rnd.getFloat(-1.0f, 1.0f);
				float	y0		= rnd.getFloat(-1.0f, 1.0f);
				float	z0		= rnd.getFloat(-1.0f, 1.0f);
				float	x1		= rnd.getFloat(-1.0f, 1.0f);
				float	y1		= rnd.getFloat(-1.0f, 1.0f);
				float	z1		= rnd.getFloat(-1.0f, 1.0f);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(r,g,b,a) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(x0, y0, z0), Vec3(x1, y1, z1));
			}
		}

		glDisable(GL_DEPTH_TEST);
		glDisable(GL_STENCIL_TEST);
		checkError();

		// Resolve using glBlitFramebuffer().
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, resolveFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT | (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0), GL_NEAREST);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, resolveFbo);

		if (depth)
		{
			// Visualize depth.
			const int	numSteps	= 8;
			const float	step		= 2.0f / (float)numSteps;

			glEnable(GL_DEPTH_TEST);
			glDepthFunc(GL_LESS);
			glDepthMask(GL_FALSE);
			glColorMask(GL_FALSE, GL_FALSE, GL_TRUE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				float d = -1.0f + step*(float)ndx;
				float c = (float)ndx / (float)(numSteps-1);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, c, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, d), Vec3(1.0f, 1.0f, d));
			}

			glDisable(GL_DEPTH_TEST);
		}

		if (stencil)
		{
			// Visualize stencil.
			const int	numSteps	= 4;
			const int	step		= 1;

			glEnable(GL_STENCIL_TEST);
			glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
			glColorMask(GL_FALSE, GL_TRUE, GL_FALSE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				int		s	= step*ndx;
				float	c	= (float)ndx / (float)(numSteps-1);

				glStencilFunc(GL_EQUAL, s, 0xffu);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, c, 0.0f, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}

			glDisable(GL_STENCIL_TEST);
		}

		readPixels(dst, 0, 0, m_size.x(), m_size.y(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}